

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_secret.cpp
# Opt level: O3

unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true> __thiscall
duckdb::Transformer::TransformSecret(Transformer *this,PGCreateSecretStmt *stmt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> _Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var3;
  _Head_base<0UL,_duckdb::CreateSecretInfo_*,_false> _Var4;
  _Head_base<0UL,_duckdb::CreateStatement_*,_false> _Var5;
  OnCreateConflict on_conflict;
  SecretPersistType persist_type;
  Transformer *this_00;
  CreateSecretInfo *this_01;
  pointer pCVar6;
  type info;
  type expr;
  long *plVar7;
  pointer pCVar8;
  ParserException *this_02;
  InvalidInputException *this_03;
  size_type *psVar9;
  long in_RDX;
  Transformer *this_04;
  Value value;
  _Head_base<0UL,_duckdb::CreateSecretInfo_*,_false> local_e0;
  string local_d8;
  _Head_base<0UL,_duckdb::CreateStatement_*,_false> local_b8;
  Value local_b0;
  string local_70;
  string local_50;
  
  this_00 = (Transformer *)operator_new(0x80);
  this_04 = this_00;
  CreateStatement::CreateStatement((CreateStatement *)this_00);
  (this->parent).ptr = this_00;
  local_b8._M_head_impl = (CreateStatement *)this;
  on_conflict = TransformOnConflict(this_04,*(PGOnCreateConflict *)(in_RDX + 0x30));
  ::std::__cxx11::string::string((string *)&local_d8,*(char **)(in_RDX + 8),(allocator *)&local_70);
  StringUtil::Upper((string *)&local_b0,&local_d8);
  persist_type = EnumUtil::FromString<duckdb::SecretPersistType>((char *)local_b0.type_._0_8_);
  this_01 = (CreateSecretInfo *)operator_new(0x1c0);
  CreateSecretInfo::CreateSecretInfo(this_01,on_conflict,persist_type);
  pp_Var3 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_b0 + 0x10);
  local_e0._M_head_impl = this_01;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_b0.type_._0_8_ != pp_Var3) {
    operator_delete((void *)local_b0.type_._0_8_);
  }
  paVar1 = &local_d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (*(char **)(in_RDX + 0x10) != (char *)0x0) {
    ::std::__cxx11::string::string
              ((string *)&local_d8,*(char **)(in_RDX + 0x10),(allocator *)&local_70);
    StringUtil::Lower((string *)&local_b0,&local_d8);
    pCVar6 = unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
                           *)&local_e0);
    ::std::__cxx11::string::operator=((string *)&pCVar6->name,(string *)&local_b0);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_b0.type_._0_8_ != pp_Var3) {
      operator_delete((void *)local_b0.type_._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  if (*(char **)(in_RDX + 0x18) != (char *)0x0) {
    ::std::__cxx11::string::string
              ((string *)&local_d8,*(char **)(in_RDX + 0x18),(allocator *)&local_70);
    StringUtil::Lower((string *)&local_b0,&local_d8);
    pCVar6 = unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
                           *)&local_e0);
    ::std::__cxx11::string::operator=((string *)&pCVar6->storage_type,(string *)&local_b0);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_b0.type_._0_8_ != pp_Var3) {
      operator_delete((void *)local_b0.type_._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  if (*(long *)(in_RDX + 0x28) != 0) {
    info = unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
           ::operator*((unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
                        *)&local_e0);
    TransformCreateSecretOptions((Transformer *)stmt,info,*(PGList **)(in_RDX + 0x28));
  }
  pCVar6 = unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
                         *)&local_e0);
  if ((pCVar6->type).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    pCVar6 = unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
                           *)&local_e0);
    if ((pCVar6->name)._M_string_length == 0) {
      pCVar6 = unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
                             *)&local_e0);
      expr = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator*(&pCVar6->type);
      GetConstantExpressionValue(&local_b0,expr);
      local_d8._M_dataplus._M_p = (pointer)paVar1;
      if (local_b0.is_null == true) {
        this_03 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,
                   "Can not combine a non-constant expression for the secret type with a default-named secret. Either provide an explicit secret name or use a constant expression for the secret type."
                   ,"");
        InvalidInputException::InvalidInputException(this_03,&local_d8);
        __cxa_throw(this_03,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      Value::ToString_abi_cxx11_(&local_50,&local_b0);
      StringUtil::Lower(&local_70,(string *)&local_50);
      plVar7 = (long *)::std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1d97e69);
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_d8.field_2._M_allocated_capacity = *psVar9;
        local_d8.field_2._8_8_ = plVar7[3];
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar9;
        local_d8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_d8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      pCVar6 = unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
                             *)&local_e0);
      ::std::__cxx11::string::operator=((string *)&pCVar6->name,(string *)&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      Value::~Value(&local_b0);
    }
    _Var4._M_head_impl = local_e0._M_head_impl;
    local_e0._M_head_impl = (CreateSecretInfo *)0x0;
    pCVar8 = unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
             ::operator->((unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
                           *)local_b8._M_head_impl);
    _Var2._M_head_impl =
         (pCVar8->info).
         super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
         super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
         super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
    (pCVar8->info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
    _M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
    super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl =
         &(_Var4._M_head_impl)->super_CreateInfo;
    if (_Var2._M_head_impl != (CreateInfo *)0x0) {
      (**(code **)(*(long *)&(_Var2._M_head_impl)->super_ParseInfo + 8))();
    }
    _Var5._M_head_impl = local_b8._M_head_impl;
    if (local_e0._M_head_impl != (CreateSecretInfo *)0x0) {
      (*((local_e0._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
    }
    return (unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>_>)
           (_Tuple_impl<0UL,_duckdb::CreateStatement_*,_std::default_delete<duckdb::CreateStatement>_>
            )_Var5._M_head_impl;
  }
  this_02 = (ParserException *)__cxa_allocate_exception(0x10);
  local_b0.type_._0_8_ = pp_Var3;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"Failed to create secret - secret must have a type defined","");
  ParserException::ParserException(this_02,(string *)&local_b0);
  __cxa_throw(this_02,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<CreateStatement> Transformer::TransformSecret(duckdb_libpgquery::PGCreateSecretStmt &stmt) {
	auto result = make_uniq<CreateStatement>();

	auto create_secret_info =
	    make_uniq<CreateSecretInfo>(TransformOnConflict(stmt.onconflict),
	                                EnumUtil::FromString<SecretPersistType>(StringUtil::Upper(stmt.persist_type)));

	if (stmt.secret_name) {
		create_secret_info->name = StringUtil::Lower(stmt.secret_name);
	}

	if (stmt.secret_storage) {
		create_secret_info->storage_type = StringUtil::Lower(stmt.secret_storage);
	}

	if (stmt.options) {
		TransformCreateSecretOptions(*create_secret_info, stmt.options);
	}

	if (!create_secret_info->type) {
		throw ParserException("Failed to create secret - secret must have a type defined");
	}
	if (create_secret_info->name.empty()) {
		auto value = GetConstantExpressionValue(*create_secret_info->type);
		if (value.IsNull()) {
			throw InvalidInputException(
			    "Can not combine a non-constant expression for the secret type with a default-named secret. Either "
			    "provide an explicit secret name or use a constant expression for the secret type.");
		}
		create_secret_info->name = "__default_" + StringUtil::Lower(value.ToString());
	}

	result->info = std::move(create_secret_info);

	return result;
}